

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error storeAttributeValue(XML_Parser parser,ENCODING *enc,int isCdata,char *ptr,char *end,
                             STRING_POOL *pool)

{
  XML_Char *pXVar1;
  XML_Error XVar2;
  int iVar3;
  
  XVar2 = appendAttributeValue(parser,enc,isCdata,ptr,end,pool);
  if (XVar2 == XML_ERROR_NONE) {
    if (((isCdata == 0) && (pXVar1 = pool->ptr, pXVar1 != pool->start)) && (pXVar1[-1] == ' ')) {
      pool->ptr = pXVar1 + -1;
    }
    if ((pool->ptr == pool->end) && (iVar3 = poolGrow(pool), iVar3 == 0)) {
      return XML_ERROR_NO_MEMORY;
    }
    pXVar1 = pool->ptr;
    pool->ptr = pXVar1 + 1;
    *pXVar1 = '\0';
    XVar2 = XML_ERROR_NONE;
  }
  return XVar2;
}

Assistant:

static enum XML_Error
storeAttributeValue(XML_Parser parser, const ENCODING *enc, int isCdata,
                    const char *ptr, const char *end,
                    STRING_POOL *pool)
{
  enum XML_Error result = appendAttributeValue(parser, enc, isCdata, ptr, end, pool);
  if (result)
    return result;
  if (!isCdata && poolLength(pool) && poolLastChar(pool) == 0x20)
    poolChop(pool);
  if (!poolAppendChar(pool, XML_T('\0')))
    return XML_ERROR_NO_MEMORY;
  return XML_ERROR_NONE;
}